

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O0

void __thiscall LTAircraft::UpdatePosition(LTAircraft *this,float param_2,int cycle)

{
  bool bVar1;
  string *psVar2;
  char *pcVar3;
  string *src;
  int in_ESI;
  LTAircraft *in_RDI;
  float fVar4;
  float rpm;
  float fVar5;
  float fVar6;
  double dVar7;
  LTAircraft *in_stack_00000010;
  LTAircraft *in_stack_000000b8;
  exception *e;
  FDStaticData statCopy;
  FDDynamicData dynCopy;
  float in_stack_fffffffffffffb8c;
  undefined1 _b;
  int in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  size_t in_stack_fffffffffffffb98;
  LTAircraft *in_stack_fffffffffffffba0;
  size_t in_stack_fffffffffffffba8;
  char *pcVar8;
  char *in_stack_fffffffffffffbb0;
  allocator<char> *in_stack_fffffffffffffbc0;
  allocator<char> *__a;
  char *in_stack_fffffffffffffbc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffbd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  double in_stack_fffffffffffffbd8;
  Aircraft *in_stack_fffffffffffffbe0;
  LTFlightData *in_stack_fffffffffffffbe8;
  undefined1 local_2d1 [33];
  string local_2b0 [39];
  allocator<char> local_289;
  string local_288 [32];
  string local_268 [39];
  allocator<char> local_241;
  string local_240 [32];
  string local_220 [440];
  long local_68;
  long local_60;
  XPMPTransponderMode local_58;
  
  if (in_ESI != currCycle.num) {
    NextCycle(in_stack_fffffffffffffb90);
  }
  bVar1 = XPMP2::Aircraft::IsValid(&in_RDI->super_Aircraft);
  if (((bVar1) && (bVar1 = DataRefs::IsReInitAll(&dataRefs), !bVar1)) &&
     (bVar1 = CalcPPos(in_stack_000000b8), bVar1)) {
    bVar1 = ShallUpdateModel(in_RDI);
    if (bVar1) {
      ChangeModel(in_stack_00000010);
    }
    positionTy::lat(&in_RDI->ppos);
    positionTy::lon(&in_RDI->ppos);
    positionTy::alt_ft((positionTy *)0x19a667);
    XPMP2::Aircraft::SetLocation
              (in_stack_fffffffffffffbe0,in_stack_fffffffffffffbd8,(double)in_stack_fffffffffffffbd0
               ,(double)in_stack_fffffffffffffbc8);
    GetPitch((LTAircraft *)0x19a6a9);
    dVar7 = nanToZero((double)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    (in_RDI->super_Aircraft).drawInfo.pitch = (float)dVar7;
    GetRoll((LTAircraft *)0x19a6ef);
    dVar7 = nanToZero((double)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    (in_RDI->super_Aircraft).drawInfo.roll = (float)dVar7;
    GetHeading((LTAircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    dVar7 = nanToZero((double)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    (in_RDI->super_Aircraft).drawInfo.heading = (float)dVar7;
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetGearRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetFlapRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    XPMP2::Aircraft::GetFlapRatio((Aircraft *)0x19a7f1);
    XPMP2::Aircraft::SetSlatRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetSpoilerRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    XPMP2::Aircraft::GetSpoilerRatio((Aircraft *)0x19a85c);
    XPMP2::Aircraft::SetSpeedbrakeRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetReversDeployRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetThrustReversRatio
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    bVar1 = Doc8643::hasRotor((Doc8643 *)
                              CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    if (bVar1) {
      XPMP2::Aircraft::SetEngineRotRpm
                (&in_stack_fffffffffffffba0->super_Aircraft,
                 (float)(in_stack_fffffffffffffb98 >> 0x20));
    }
    else {
      XPMP2::Aircraft::GetThrustRatio((Aircraft *)0x19a977);
      XPMP2::Aircraft::SetEngineRotRpm
                (&in_stack_fffffffffffffba0->super_Aircraft,
                 (float)(in_stack_fffffffffffffb98 >> 0x20));
    }
    XPMP2::Aircraft::GetEngineRotRpm((Aircraft *)0x19a9dd);
    XPMP2::Aircraft::SetPropRotRpm
              (&in_stack_fffffffffffffba0->super_Aircraft,(float)(in_stack_fffffffffffffb98 >> 0x20)
              );
    XPMP2::Aircraft::GetEngineRotAngle((Aircraft *)0x19aa0d);
    fVar4 = XPMP2::Aircraft::GetEngineRotRpm((Aircraft *)0x19aa25);
    RpmToDegree(fVar4,currCycle.diffTime);
    XPMP2::Aircraft::SetEngineRotAngle
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    while (fVar4 = XPMP2::Aircraft::GetEngineRotAngle((Aircraft *)0x19aa85), 360.0 <= fVar4) {
      XPMP2::Aircraft::GetEngineRotAngle((Aircraft *)0x19aab3);
      XPMP2::Aircraft::SetEngineRotAngle
                ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
    }
    XPMP2::Aircraft::GetEngineRotAngle((Aircraft *)0x19aaf1);
    XPMP2::Aircraft::SetPropRotAngle
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetTireDeflection
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    MovingParam::get((MovingParam *)in_stack_fffffffffffffba0);
    XPMP2::Aircraft::SetTireRotRpm
              (&in_stack_fffffffffffffba0->super_Aircraft,(float)(in_stack_fffffffffffffb98 >> 0x20)
              );
    fVar4 = XPMP2::Aircraft::GetTireRotAngle((Aircraft *)0x19ab97);
    rpm = XPMP2::Aircraft::GetTireRotRpm((Aircraft *)0x19abaf);
    fVar5 = RpmToDegree(rpm,currCycle.diffTime);
    XPMP2::Aircraft::SetTireRotAngle
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
               in_stack_fffffffffffffb8c);
    while (fVar6 = XPMP2::Aircraft::GetTireRotAngle((Aircraft *)0x19ac0f), 360.0 <= fVar6) {
      XPMP2::Aircraft::GetTireRotAngle((Aircraft *)0x19ac3d);
      XPMP2::Aircraft::SetTireRotAngle
                ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),
                 in_stack_fffffffffffffb8c);
    }
    bVar1 = MovingParam::isIncrease(&in_RDI->reversers);
    _b = (undefined1)((uint)in_stack_fffffffffffffb8c >> 0x18);
    if (bVar1) {
      MovingParam::inMotion(&in_RDI->reversers);
    }
    XPMP2::Aircraft::SetTouchDown
              ((Aircraft *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90),(bool)_b);
    if (currCycle.num % 100 < 2) {
      LTFlightData::FDDynamicData::FDDynamicData
                ((FDDynamicData *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      bVar1 = LTFlightData::TryGetSafeCopy
                        ((LTFlightData *)CONCAT44(fVar4,rpm),(FDDynamicData *)CONCAT44(fVar5,fVar6))
      ;
      if (bVar1) {
        (in_RDI->super_Aircraft).acRadar.size = local_68;
        (in_RDI->super_Aircraft).acRadar.code = local_60;
        (in_RDI->super_Aircraft).acRadar.mode = local_58;
      }
    }
    if ((in_RDI->phase == FPH_PARKED) ||
       (((bVar1 = DataRefs::IsAINotOnGnd(&dataRefs), bVar1 &&
         (bVar1 = IsOnRwy(in_stack_fffffffffffffba0), !bVar1)) && (in_RDI->phase == FPH_TAXI)))) {
      (in_RDI->super_Aircraft).acRadar.mode = xpmpTransponderMode_Standby;
    }
    bVar1 = ShallSendNewInfoData(in_RDI);
    if (bVar1) {
      LTFlightData::FDStaticData::FDStaticData
                ((FDStaticData *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
      bVar1 = LTFlightData::TryGetSafeCopy
                        (in_stack_fffffffffffffbe8,(FDStaticData *)in_stack_fffffffffffffbe0);
      if (bVar1) {
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        strAtMost((string *)in_stack_fffffffffffffbe8,(size_t)in_stack_fffffffffffffbe0);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_220);
        std::__cxx11::string::~string(local_240);
        std::allocator<char>::~allocator(&local_241);
        pcVar8 = (in_RDI->super_Aircraft).acInfoTexts.model;
        psVar2 = (string *)std::__cxx11::string::c_str();
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffbd0,in_stack_fffffffffffffbc8,in_stack_fffffffffffffbc0);
        strAtMost(psVar2,(size_t)pcVar8);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_268);
        std::__cxx11::string::~string(local_288);
        std::allocator<char>::~allocator(&local_289);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        __a = (allocator<char> *)(in_RDI->super_Aircraft).acInfoTexts.airline;
        pcVar3 = (char *)std::__cxx11::string::c_str();
        this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d1;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>(this_00,pcVar3,__a);
        strAtMost(psVar2,(size_t)pcVar8);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        std::__cxx11::string::~string(local_2b0);
        std::__cxx11::string::~string((string *)(local_2d1 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2d1);
        std::__cxx11::string::c_str();
        strncpy_s(in_stack_fffffffffffffbb0,in_stack_fffffffffffffba8,
                  (char *)in_stack_fffffffffffffba0,in_stack_fffffffffffffb98);
        pcVar8 = (in_RDI->super_Aircraft).acInfoTexts.aptFrom;
        psVar2 = LTFlightData::FDStaticData::origin_abi_cxx11_
                           ((FDStaticData *)
                            CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        std::__cxx11::string::c_str();
        strncpy_s((char *)psVar2,(size_t)pcVar8,(char *)in_stack_fffffffffffffba0,
                  in_stack_fffffffffffffb98);
        pcVar3 = (in_RDI->super_Aircraft).acInfoTexts.aptTo;
        src = LTFlightData::FDStaticData::dest_abi_cxx11_
                        ((FDStaticData *)
                         CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
        std::__cxx11::string::c_str();
        strncpy_s((char *)psVar2,(size_t)pcVar8,(char *)src,(size_t)pcVar3);
      }
      LTFlightData::FDStaticData::~FDStaticData
                ((FDStaticData *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90));
    }
  }
  return;
}

Assistant:

void LTAircraft::UpdatePosition (float, int cycle)
{
    try {
        // We (LT) don't get called anywhere else once per frame.
        // XPMP API calls directly for aircraft positions.
        // So we need to figure out our way if we are called the first time of a cycle
        if ( cycle != currCycle.num )            // new cycle!
            NextCycle(cycle);
        
        // object invalid (due to exceptions most likely), don't use anymore, don't call LT functions
        if (!IsValid() ||
            dataRefs.IsReInitAll())
            return;

#ifdef DEBUG
        gSelAcCalc = fd.bIsSelected = bIsSelected = (key() == dataRefs.GetSelectedAcKey());
#endif
        
        
        // *** Position ***
        if (!CalcPPos())
            return;
        
        // If needed update the chosen CSL model
        if (ShallUpdateModel())
            ChangeModel();
        
        // Set Position
        SetLocation(ppos.lat(), ppos.lon(), ppos.alt_ft());
        drawInfo.pitch   = float(nanToZero(GetPitch()));
        drawInfo.roll    = float(nanToZero(GetRoll()));
        drawInfo.heading = float(nanToZero(GetHeading()));
        
        // *** Configuration ***
        
        SetGearRatio((float)gear.get());                // gear
        SetFlapRatio((float)flaps.get());               // flaps, and slats the same
        SetSlatRatio(GetFlapRatio());
        SetSpoilerRatio((float)spoilers.get());         // spoilers, and speed brakes the same
        SetSpeedbrakeRatio(GetSpoilerRatio());
        SetReversDeployRatio((float)reversers.get());   // opening reversers
        SetThrustReversRatio((float)reversers.get());

        // for engine / prop rotation we derive a value based on flight model
        if (pDoc8643->hasRotor())
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX));
        else
            SetEngineRotRpm(float(pMdl->PROP_RPM_MAX/2 + GetThrustRatio() * pMdl->PROP_RPM_MAX/2));
        SetPropRotRpm(GetEngineRotRpm());
        
        // Make props and rotors move based on rotation speed and time passed since last cycle
        SetEngineRotAngle(GetEngineRotAngle() + RpmToDegree(GetEngineRotRpm(), currCycle.diffTime));

        while (GetEngineRotAngle() >= 360.0f)
            SetEngineRotAngle(GetEngineRotAngle() - 360.0f);
        SetPropRotAngle(GetEngineRotAngle());
        
        // Gear deflection - has an effect during touch-down only
        SetTireDeflection((float)gearDeflection.get());
        
        // Tire rotation similarly
        SetTireRotRpm((float)tireRpm.get());
        SetTireRotAngle(GetTireRotAngle() + RpmToDegree(GetTireRotRpm(), currCycle.diffTime));
        while (GetTireRotAngle() >= 360.0f)
            SetTireRotAngle(GetTireRotAngle() - 360.0f);

        // 'moment' of touch down?
        // (We use the reversers deploy time for this...that's 2s)
        SetTouchDown(reversers.isIncrease() && reversers.inMotion());
        
        // *** Radar ***
        
        // for radar 'calculation' we need some dynData
        // but radar doesn't change often...just only check every 100th cycle
        if ( currCycle.num % 100 <= 1 )
        {
            // fetch new data if available
            LTFlightData::FDDynamicData dynCopy;
            if ( fd.TryGetSafeCopy(dynCopy) )
            {
                // copy fresh radar data
                acRadar               = dynCopy.radar;
            }
        }
        
        // -> deactivate TCAS in some cases like parked or taxiing outside runway
        // (will be re-activated by the above code every 100th cycle)
        if (phase == FPH_PARKED ||
            (dataRefs.IsAINotOnGnd() && !IsOnRwy() && phase == FPH_TAXI))
            acRadar.mode = xpmpTransponderMode_Standby;

        // *** Informational Texts ***

        // Is there new data to send?
        if (ShallSendNewInfoData())
        {
            // fetch new data if available
            LTFlightData::FDStaticData statCopy;
            if (fd.TryGetSafeCopy(statCopy))
            {
                // copy data over to libxplanemp
                STRCPY_S     (acInfoTexts.tailNum,      statCopy.reg.c_str());
                STRCPY_S     (acInfoTexts.icaoAcType,   statCopy.acTypeIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.manufacturer, statCopy.man.c_str());
                STRCPY_ATMOST(acInfoTexts.model,        statCopy.mdl.c_str());
                STRCPY_S     (acInfoTexts.icaoAirline,  statCopy.opIcao.c_str());
                STRCPY_ATMOST(acInfoTexts.airline,      statCopy.op.c_str());
                STRCPY_S     (acInfoTexts.flightNum,    statCopy.flight.c_str());
                STRCPY_S     (acInfoTexts.aptFrom,      statCopy.origin().c_str());
                STRCPY_S     (acInfoTexts.aptTo,        statCopy.dest().c_str());
            }
        }
        
        // Done, ie. in success case we return here
        return;
        
    } catch (const std::exception& e) {
        LOG_MSG(logERR, ERR_TOP_LEVEL_EXCEPTION, e.what());
    } catch (...) {}

    // for any kind of exception: don't use this object any more!
    SetInvalid();
}